

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseString(Parser *this,Value *val,bool use_string_pooling)

{
  uint16_t *this_00;
  size_type sVar1;
  Offset<flatbuffers::String> t;
  char in_CL;
  undefined7 in_register_00000011;
  CheckedError *ce;
  string s;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  string local_48;
  
  sVar1 = (val->constant)._M_string_length;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,sVar1,(val->constant).field_2._M_allocated_capacity + sVar1);
  Expect(this,(int)val);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    this_00 = &val[6].type.fixed_length;
    if (in_CL == '\0') {
      FlatBufferBuilderImpl<false>::CreateStringImpl
                ((FlatBufferBuilderImpl<false> *)this_00,(char *)local_68,local_60);
      NumToString<unsigned_int>(&local_48,val[7].type.base_type);
    }
    else {
      t = FlatBufferBuilderImpl<false>::CreateSharedString
                    ((FlatBufferBuilderImpl<false> *)this_00,(char *)local_68,local_60);
      NumToString<unsigned_int>(&local_48,t.o);
    }
    std::__cxx11::string::operator=
              ((string *)(CONCAT71(in_register_00000011,use_string_pooling) + 0x20),
               (string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseString(Value &val, bool use_string_pooling) {
  auto s = attribute_;
  EXPECT(kTokenStringConstant);
  if (use_string_pooling) {
    val.constant = NumToString(builder_.CreateSharedString(s).o);
  } else {
    val.constant = NumToString(builder_.CreateString(s).o);
  }
  return NoError();
}